

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndGroup(void)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  ImGuiWindow *pIVar6;
  ImGuiGroupData *pIVar7;
  float fVar8;
  ImGuiContext *pIVar9;
  ulong uVar10;
  ImGuiContext *g;
  uint uVar11;
  ImVec2 IVar12;
  ImRect group_bb;
  ImRect local_38;
  ImVec2 local_28;
  
  pIVar9 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  pIVar6->WriteAccessed = true;
  uVar11 = (pIVar6->DC).GroupStack.Size;
  uVar10 = (ulong)uVar11;
  if (uVar10 == 0) {
    __assert_fail("!window->DC.GroupStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x3157,"void ImGui::EndGroup()");
  }
  if (0 < (int)uVar11) {
    pIVar7 = (pIVar6->DC).GroupStack.Data;
    local_38.Min = pIVar7[uVar10 - 1].BackupCursorPos;
    IVar12 = (pIVar6->DC).CursorMaxPos;
    local_38.Max.x = IVar12.x;
    local_38.Max.y = IVar12.y;
    local_38.Max.x =
         (float)(~-(uint)(local_38.Max.x <= local_38.Min.x) & (uint)local_38.Max.x |
                -(uint)(local_38.Max.x <= local_38.Min.x) & (uint)local_38.Min.x);
    fVar8 = (float)(~-(uint)(local_38.Max.y <= local_38.Min.y) & (uint)local_38.Max.y |
                   -(uint)(local_38.Max.y <= local_38.Min.y) & (uint)local_38.Min.y);
    local_38.Max.y = fVar8;
    (pIVar6->DC).CursorPos = local_38.Min;
    fVar1 = pIVar7[uVar10 - 1].BackupCursorMaxPos.x;
    fVar2 = pIVar7[uVar10 - 1].BackupCursorMaxPos.y;
    fVar3 = (pIVar6->DC).CursorMaxPos.x;
    fVar4 = (pIVar6->DC).CursorMaxPos.y;
    uVar11 = -(uint)(fVar3 <= fVar1);
    IVar12.x = (float)(~uVar11 & (uint)fVar3 | (uint)fVar1 & uVar11);
    uVar11 = -(uint)(fVar4 <= fVar2);
    IVar12.y = (float)(~uVar11 & (uint)fVar4 | (uint)fVar2 & uVar11);
    (pIVar6->DC).CursorMaxPos = IVar12;
    (pIVar6->DC).CurrentLineHeight = pIVar7[uVar10 - 1].BackupCurrentLineHeight;
    fVar1 = pIVar7[uVar10 - 1].BackupCurrentLineTextBaseOffset;
    (pIVar6->DC).CurrentLineTextBaseOffset = fVar1;
    (pIVar6->DC).IndentX = pIVar7[uVar10 - 1].BackupIndentX;
    (pIVar6->DC).GroupOffsetX = pIVar7[uVar10 - 1].BackupGroupOffsetX;
    (pIVar6->DC).LogLinePosY = (pIVar6->DC).CursorPos.y + -9999.0;
    if (pIVar7[uVar10 - 1].AdvanceCursor == true) {
      fVar2 = (pIVar6->DC).PrevLineTextBaseOffset;
      uVar11 = -(uint)(fVar1 <= fVar2);
      (pIVar6->DC).CurrentLineTextBaseOffset = (float)(~uVar11 & (uint)fVar1 | (uint)fVar2 & uVar11)
      ;
      local_28.y = fVar8 - local_38.Min.y;
      local_28.x = local_38.Max.x - local_38.Min.x;
      ItemSize(&local_28,fVar1);
      ItemAdd(&local_38,0,(ImRect *)0x0);
    }
    if ((((pIVar7[uVar10 - 1].BackupActiveIdIsAlive == false) && (pIVar9->ActiveIdIsAlive == true))
        && (pIVar9->ActiveId != 0)) && (pIVar9->ActiveIdWindow->RootWindow == pIVar6->RootWindow)) {
      (pIVar6->DC).LastItemId = pIVar9->ActiveId;
    }
    (pIVar6->DC).LastItemRect.Min = local_38.Min;
    (pIVar6->DC).LastItemRect.Max = local_38.Max;
    iVar5 = (pIVar6->DC).GroupStack.Size;
    if (0 < iVar5) {
      (pIVar6->DC).GroupStack.Size = iVar5 + -1;
      return;
    }
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                  ,0x4e1,"void ImVector<ImGuiGroupData>::pop_back() [T = ImGuiGroupData]");
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4ca,"value_type &ImVector<ImGuiGroupData>::back() [T = ImGuiGroupData]");
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(!window->DC.GroupStack.empty());    // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = window->DC.GroupStack.back();

    ImRect group_bb(group_data.BackupCursorPos, window->DC.CursorMaxPos);
    group_bb.Max = ImMax(group_bb.Min, group_bb.Max);

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.CurrentLineHeight = group_data.BackupCurrentLineHeight;
    window->DC.CurrentLineTextBaseOffset = group_data.BackupCurrentLineTextBaseOffset;
    window->DC.IndentX = group_data.BackupIndentX;
    window->DC.GroupOffsetX = group_data.BackupGroupOffsetX;
    window->DC.LogLinePosY = window->DC.CursorPos.y - 9999.0f;

    if (group_data.AdvanceCursor)
    {
        window->DC.CurrentLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrentLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
        ItemSize(group_bb.GetSize(), group_data.BackupCurrentLineTextBaseOffset);
        ItemAdd(group_bb, 0);
    }

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive() will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but if you search for LastItemId you'll notice it is only used in that context.
    const bool active_id_within_group = (!group_data.BackupActiveIdIsAlive && g.ActiveIdIsAlive && g.ActiveId && g.ActiveIdWindow->RootWindow == window->RootWindow);
    if (active_id_within_group)
        window->DC.LastItemId = g.ActiveId;
    window->DC.LastItemRect = group_bb;

    window->DC.GroupStack.pop_back();

    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}